

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O2

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::PurgeReleaseQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    *this,SoftwareQueueIndex QueueInd,bool ForceRelease)

{
  CommandQueue *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  char (*in_RCX) [27];
  ulong uVar3;
  string msg;
  Uint64 CompletedFenceValue;
  
  uVar3 = (ulong)QueueInd.m_Value;
  if (this->m_CmdQueueCount <= uVar3) {
    FormatString<char[26],char[27]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6dc2ad,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PurgeReleaseQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x99);
    std::__cxx11::string::~string((string *)&msg);
  }
  pCVar1 = this->m_CommandQueues;
  if (ForceRelease) {
    CompletedFenceValue = 0xffffffffffffffff;
  }
  else {
    iVar2 = (*((pCVar1[uVar3].CmdQueue.m_pObject)->super_ICommandQueue).super_IObject._vptr_IObject
              [5])();
    CompletedFenceValue = CONCAT44(extraout_var,iVar2);
  }
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::Purge
            (&pCVar1[uVar3].ReleaseQueue,CompletedFenceValue);
  return;
}

Assistant:

void PurgeReleaseQueue(SoftwareQueueIndex QueueInd, bool ForceRelease = false)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto& Queue               = m_CommandQueues[QueueInd];
        auto  CompletedFenceValue = ForceRelease ? std::numeric_limits<Uint64>::max() : Queue.CmdQueue->GetCompletedFenceValue();
        Queue.ReleaseQueue.Purge(CompletedFenceValue);
    }